

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O2

Surface * __thiscall SDL2pp::Surface::SetColorKey(Surface *this,bool flag,Uint32 key)

{
  int iVar1;
  Exception *this_00;
  undefined4 in_register_00000014;
  undefined7 in_register_00000031;
  
  iVar1 = SDL_SetColorKey(this->surface_,CONCAT71(in_register_00000031,flag),
                          CONCAT44(in_register_00000014,key));
  if (iVar1 == 0) {
    return this;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_SetColorKey");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Surface& Surface::SetColorKey(bool flag, Uint32 key) {
	if (SDL_SetColorKey(surface_, flag, key) != 0)
		throw Exception("SDL_SetColorKey");
	return *this;
}